

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

void aux_lines(lua_State *L,int toclose)

{
  int iVar1;
  
  iVar1 = lua_gettop(L);
  if (0xfb < iVar1) {
    luaL_argerror(L,0xfc,"too many arguments");
  }
  lua_pushinteger(L,(long)(iVar1 + -1));
  lua_pushboolean(L,toclose);
  lua_rotate(L,2,2);
  lua_pushcclosure(L,io_readline,iVar1 + 2);
  return;
}

Assistant:

static void aux_lines(lua_State *L, int toclose) {
    int n = lua_gettop(L) - 1;  /* number of arguments to read */
    luaL_argcheck(L, n <= MAXARGLINE, MAXARGLINE + 2, "too many arguments");
    lua_pushinteger(L, n);  /* number of arguments to read */
    lua_pushboolean(L, toclose);  /* close/not close file when finished */
    lua_rotate(L, 2, 2);  /* move 'n' and 'toclose' to their positions */
    lua_pushcclosure(L, io_readline, 3 + n);
}